

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

word Extra_Truth6MinimumExact(word t,int *pComp,int *pPerm)

{
  word wVar1;
  ulong local_58;
  int local_4c;
  int local_48;
  int c;
  int p;
  int i;
  word tTemp2;
  word tTemp1;
  word tCur;
  word tMin;
  int *pPerm_local;
  int *pComp_local;
  word t_local;
  
  tCur = 0xffffffffffffffff;
  c = 0;
  do {
    if (1 < c) {
      return tCur;
    }
    local_58 = t;
    if (c != 0) {
      local_58 = t ^ 0xffffffffffffffff;
    }
    tTemp1 = local_58;
    for (local_48 = 0; wVar1 = tTemp1, local_48 < 0x2d0; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < 0x40; local_4c = local_4c + 1) {
        tCur = Abc_MinWord(tCur,tTemp1);
        tTemp1 = Extra_Truth6ChangePhase(tTemp1,pComp[local_4c]);
      }
      if (wVar1 != tTemp1) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x907,"word Extra_Truth6MinimumExact(word, int *, int *)");
      }
      tTemp1 = Extra_Truth6SwapAdjacent(tTemp1,pPerm[local_48]);
    }
    if (local_58 != tTemp1) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x90a,"word Extra_Truth6MinimumExact(word, int *, int *)");
    }
    c = c + 1;
  } while( true );
}

Assistant:

word Extra_Truth6MinimumExact( word t, int * pComp, int * pPerm )
{
    word tMin = ~(word)0;
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~t : t;
        tTemp1 = tCur;
        for ( p = 0; p < 720; p++ )
        {
//            printf( "Trying perm %d:\n", p );
//            Kit_DsdPrintFromTruth( &tCur, 6 ), printf( "\n" );;
            tTemp2 = tCur;
            for ( c = 0; c < 64; c++ )
            {
                tMin = Abc_MinWord( tMin, tCur );
                tCur = Extra_Truth6ChangePhase( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Extra_Truth6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    return tMin;
}